

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

double __thiscall
nivalis::Expr::newton
          (Expr *this,uint64_t var_addr,double x0,Environment *env,double eps_step,double eps_abs,
          int max_iter,double xmin,double xmax,Expr *deriv,double fx0,double dfx0)

{
  double dVar1;
  uint uVar2;
  reference pvVar3;
  int in_ECX;
  vector<double,_std::allocator<double>_> *in_RDX;
  Expr *in_RSI;
  double in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  Environment *in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  Expr *in_XMM5_Qa;
  double in_XMM6_Qa;
  double delta;
  int i;
  Expr deriv_expr;
  Environment *in_stack_000000d8;
  uint64_t in_stack_000000e0;
  Expr *in_stack_000000e8;
  int local_90;
  Environment *in_stack_ffffffffffffff78;
  Expr *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff90;
  double __value;
  Expr *pEVar4;
  undefined4 in_stack_ffffffffffffffc0;
  double dVar5;
  double dVar6;
  double local_8;
  
  dVar5 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_R8 == 0.0) {
    diff(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_8 = newton(in_RSI,(uint64_t)dVar5,(double)in_RDX,in_XMM1_Qa,in_XMM2_Qa,
                     (double)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_XMM3_Qa >> 0x20),in_XMM4_Qa,in_R8,in_XMM5_Qa,in_XMM6_Qa,
                     in_stack_ffffffffffffff90);
    ~Expr((Expr *)0x139deb);
  }
  else {
    for (local_90 = 0; local_90 < in_ECX; local_90 = local_90 + 1) {
      pEVar4 = in_XMM5_Qa;
      dVar6 = dVar5;
      if (local_90 == 0) {
        __value = in_XMM6_Qa;
        dVar1 = std::numeric_limits<double>::max();
        if ((in_XMM6_Qa == dVar1) &&
           (pEVar4 = in_XMM5_Qa, dVar6 = dVar5, !NAN(in_XMM6_Qa) && !NAN(dVar1))) goto LAB_00139e57;
      }
      else {
LAB_00139e57:
        dVar5 = dVar6;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(size_type)in_RSI);
        *pvVar3 = dVar6;
        if (local_90 == 0) {
          in_XMM5_Qa = pEVar4;
          dVar6 = std::numeric_limits<double>::max();
          if (((double)pEVar4 == dVar6) && (!NAN((double)pEVar4) && !NAN(dVar6))) goto LAB_00139eac;
        }
        else {
LAB_00139eac:
          in_XMM5_Qa = (Expr *)operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          uVar2 = std::isnan((double)in_XMM5_Qa);
          if ((uVar2 & 1) != 0) {
            dVar5 = std::numeric_limits<double>::quiet_NaN();
            return dVar5;
          }
        }
        __value = operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        uVar2 = std::isnan(__value);
        if (((uVar2 & 1) != 0) || ((__value == 0.0 && (!NAN(__value))))) {
          dVar5 = std::numeric_limits<double>::quiet_NaN();
          return dVar5;
        }
      }
      dVar5 = dVar5 - (double)in_XMM5_Qa / __value;
      if ((ABS((double)in_XMM5_Qa / __value) < (double)in_XMM1_Qa) &&
         (ABS((double)in_XMM5_Qa) < in_XMM2_Qa)) {
        return dVar5;
      }
      if ((dVar5 < in_XMM3_Qa) || (in_XMM4_Qa < dVar5)) {
        dVar5 = std::numeric_limits<double>::quiet_NaN();
        return dVar5;
      }
      in_XMM6_Qa = __value;
    }
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  return local_8;
}

Assistant:

double Expr::newton(uint64_t var_addr, double x0, Environment& env,
        double eps_step, double eps_abs, int max_iter,
        double xmin, double xmax, const Expr* deriv,
        double fx0, double dfx0) const {
    if (deriv == nullptr) {
        Expr deriv_expr = diff(var_addr, env);
        return newton(var_addr, x0, env, eps_step,
                eps_abs, max_iter, xmin, xmax, &deriv_expr, fx0, dfx0);
    }
    NEWTON_PRINT("\n init@"); NEWTON_PRINT(x0);
    for (int i = 0; i < max_iter; ++i) {
        if (i || dfx0 == std::numeric_limits<double>::max()) {
            env.vars[var_addr] = x0;
            if (i || fx0 == std::numeric_limits<double>::max()) {
                fx0 = (*this)(env);
                if(std::isnan(fx0)) {
                    NEWTON_PRINT(" FAIL f=NAN");
                    return std::numeric_limits<double>::quiet_NaN(); // Fail
                }
            }
            dfx0 = (*deriv)(env);
            if(std::isnan(dfx0) || dfx0 == 0.) {
                NEWTON_PRINT(" FAIL d=NAN");
                return std::numeric_limits<double>::quiet_NaN(); // Fail
            }
        }
        double delta = fx0 / dfx0;
        x0 -= delta;
        NEWTON_PRINT(" "); NEWTON_PRINT(x0);
        if (std::fabs(delta) < eps_step && std::fabs(fx0) < eps_abs) {
            // Found root
            return x0;
        }
        if (x0 < xmin || x0 > xmax) {
            NEWTON_PRINT(" FAIL bounds");
            return std::numeric_limits<double>::quiet_NaN(); // Fail
        }
    }
    NEWTON_PRINT(" FAIL iter");
    return std::numeric_limits<double>::quiet_NaN(); // Fail
}